

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc7.c
# Opt level: O0

LispPTR N_OP_misc7(LispPTR arg1,LispPTR arg2,LispPTR arg3,LispPTR arg4,LispPTR arg5,LispPTR arg6,
                  LispPTR arg7,int alpha)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  DLword *pDVar4;
  LispPTR *pLVar5;
  DLword bmmask;
  DLword bmdata;
  int offset;
  int oldbit;
  int rasterwidth;
  int heightminus1;
  int operation;
  int y;
  int x;
  DLword *base;
  LispPTR arg6_local;
  LispPTR arg5_local;
  LispPTR arg4_local;
  LispPTR arg3_local;
  LispPTR arg2_local;
  LispPTR arg1_local;
  
  if (alpha != 1) {
    MachineState.tosvalue = arg7;
    MachineState.errorexit = 1;
    return 0xffffffff;
  }
  pDVar4 = NativeAligned2FromLAddr(arg1);
  if ((arg2 & 0xfff0000) == 0xe0000) {
    operation = arg2 & 0xffff;
LAB_00151172:
    if ((arg3 & 0xfff0000) == 0xe0000) {
      heightminus1 = arg3 & 0xffff;
    }
    else if ((arg3 & 0xfff0000) == 0xf0000) {
      heightminus1 = arg3 | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (arg3 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_001514c8;
      pLVar5 = NativeAligned4FromLAddr(arg3);
      heightminus1 = *pLVar5;
    }
    if ((arg4 & 0xfff0000) == 0xe0000) {
      rasterwidth = arg4 & 0xffff;
    }
    else if ((arg4 & 0xfff0000) == 0xf0000) {
      rasterwidth = arg4 | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (arg4 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_001514c8;
      pLVar5 = NativeAligned4FromLAddr(arg4);
      rasterwidth = *pLVar5;
    }
    if ((arg5 & 0xfff0000) == 0xe0000) {
      oldbit = arg5 & 0xffff;
    }
    else if ((arg5 & 0xfff0000) == 0xf0000) {
      oldbit = arg5 | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (arg5 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_001514c8;
      pLVar5 = NativeAligned4FromLAddr(arg5);
      oldbit = *pLVar5;
    }
    if ((arg6 & 0xfff0000) == 0xe0000) {
      offset = arg6 & 0xffff;
    }
    else if ((arg6 & 0xfff0000) == 0xf0000) {
      offset = arg6 | 0xffff0000;
    }
    else {
      if ((*(ushort *)((ulong)(MDStypetbl + (arg6 >> 9)) ^ 2) & 0x7ff) != 2) goto LAB_001514c8;
      pLVar5 = NativeAligned4FromLAddr(arg6);
      offset = *pLVar5;
    }
    iVar3 = operation;
    if (operation < 0) {
      iVar3 = operation + 0xf;
    }
    iVar3 = offset * (oldbit - heightminus1) + (iVar3 >> 4);
    uVar2 = (ushort)(0x8000 >> ((byte)operation & 0xf));
    uVar1 = *(ushort *)((ulong)(pDVar4 + iVar3) ^ 2);
    ScreenLocked = 1;
    if (rasterwidth == 0) {
      *(ushort *)((ulong)(pDVar4 + iVar3) ^ 2) = uVar1 ^ uVar2;
    }
    else if (rasterwidth == 1) {
      *(ushort *)((ulong)(pDVar4 + iVar3) ^ 2) = uVar1 & (uVar2 ^ 0xffff);
    }
    else if (rasterwidth != 2) {
      *(ushort *)((ulong)(pDVar4 + iVar3) ^ 2) = uVar1 | uVar2;
    }
    if ((DisplayRegion68k <= pDVar4) && (pDVar4 <= DISP_MAX_Address)) {
      flush_display_ptrregion(pDVar4 + iVar3,0,0x10,1);
    }
    ScreenLocked = 0;
    arg2_local = (uVar1 & uVar2) != 0 | 0xe0000;
  }
  else {
    if ((arg2 & 0xfff0000) == 0xf0000) {
      operation = arg2 | 0xffff0000;
      goto LAB_00151172;
    }
    if ((*(ushort *)((ulong)(MDStypetbl + (arg2 >> 9)) ^ 2) & 0x7ff) == 2) {
      pLVar5 = NativeAligned4FromLAddr(arg2);
      operation = *pLVar5;
      goto LAB_00151172;
    }
LAB_001514c8:
    MachineState.tosvalue = arg7;
    MachineState.errorexit = 1;
    arg2_local = 0xffffffff;
  }
  return arg2_local;
}

Assistant:

LispPTR N_OP_misc7(LispPTR arg1, LispPTR arg2, LispPTR arg3, LispPTR arg4, LispPTR arg5, LispPTR arg6, LispPTR arg7, int alpha)
{
  DLword *base;
  int x, y, operation, heightminus1, rasterwidth, oldbit;
  int offset;
  DLword bmdata;
  DLword bmmask;
#ifdef REALCURSOR
  int displayflg;
#endif

  DBPRINT(("MISC7 op with alpha byte %d.\n", alpha));

  if (alpha != 1) ERROR_EXIT(arg7);

  base = NativeAligned2FromLAddr(arg1);
  N_GETNUMBER(arg2, x, doufn);
  N_GETNUMBER(arg3, y, doufn);
  N_GETNUMBER(arg4, operation, doufn);
  N_GETNUMBER(arg5, heightminus1, doufn);
  N_GETNUMBER(arg6, rasterwidth, doufn);

  DBPRINT(("MISC7 args OK.\n"));

#ifdef REALCURSOR
  displayflg = n_new_cursorin(base, x, (heightminus1 - y), 1, 1);
  if (displayflg)
    HideCursor();
#endif

/* Bitmaps use a positive integer coordinate system with the lower left
   corner pixel at coordinate (0, 0). Storage is allocated in 16-bit words
   from the upper left corner (0, h-1), with rasterwidth 16-bit words per row.
*/
  offset = (rasterwidth * (heightminus1 - y)) + (x / BITSPER_DLWORD);
  bmmask = (1 << (BITSPER_DLWORD - 1)) >> (x & (BITSPER_DLWORD - 1));
  bmdata = GETWORDBASEWORD(base, offset);
  oldbit = bmdata & bmmask;

  ScreenLocked = T;

  switch (operation) {
  case OP_INVERT: GETWORDBASEWORD(base, offset) = bmdata ^ bmmask; break;
  case OP_ERASE: GETWORDBASEWORD(base, offset) = bmdata & ~bmmask; break;
  case OP_READ: break;
  default: GETWORDBASEWORD(base, offset) = bmdata | bmmask;
  }


#if defined(XWINDOW) || defined(SDL)
  if (in_display_segment(base)) {
    /* NB: base + offset doesn't need WORDPTR() wrapper */
    flush_display_ptrregion(base + offset, 0, 16, 1);
  }
#endif /* XWINDOW || SDL */

  ScreenLocked = NIL;
  DBPRINT(("FBITMAPBIT old bit = 0x%x.\n", oldbit));
  return (S_POSITIVE | (oldbit ? 1 : 0));

doufn:
  ERROR_EXIT(arg7);

}